

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::PathTypeHandlerBase::SetIsPrototype(PathTypeHandlerBase *this,DynamicObject *instance)

{
  int *piVar1;
  byte bVar2;
  DynamicType *oldType;
  Type *pTVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  PathTypeHandlerBase *newTypeHandler;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  
  if ((DAT_015bf346 == '\0') &&
     ((((this->super_DynamicTypeHandler).flags & 0x18) == 0 || (DAT_015bf345 == '\0')))) {
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
    return;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  bVar5 = HasSingletonInstance(this);
  if (bVar5) {
    oldSingletonInstanceBefore = (((this->typePath).ptr)->singletonInstance).ptr;
  }
  else {
    oldSingletonInstanceBefore = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  if ((((this->super_DynamicTypeHandler).flags & 0x18) == 0) || (DAT_015bf345 != '\x01')) {
    TraceFixedFieldsBeforeSetIsProto
              (instance,&this->super_DynamicTypeHandler,oldType,oldSingletonInstanceBefore);
    if ((DAT_015bf346 != '\x01') ||
       ((bVar2 = (this->super_DynamicTypeHandler).flags, (bVar2 & 0x20) != 0 &&
        (((bVar2 & 0x10) == 0 || (DAT_015bf345 != '\0')))))) goto LAB_00dc2f7c;
    bVar5 = DynamicObject::HasSharedType(instance);
    if ((bVar5) &&
       ((*(byte *)(*(long *)((instance->super_RecyclableObject).type.ptr + 1) + 9) & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xb8f,
                                  "(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared())"
                                  ,
                                  "!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared()"
                                 );
      if (!bVar5) goto LAB_00dc2fe1;
      *puVar6 = 0;
    }
    DynamicObject::ChangeType(instance);
    bVar5 = DynamicObject::HasLockedType(instance);
    if (!bVar5) {
      bVar5 = DynamicObject::HasSharedType(instance);
      if (!bVar5) goto LAB_00dc2f7c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xb92,"(!instance->HasLockedType() && !instance->HasSharedType())",
                                "!instance->HasLockedType() && !instance->HasSharedType()");
    if (!bVar5) {
LAB_00dc2fe1:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  else {
    pTVar3 = (instance->super_RecyclableObject).type.ptr;
    piVar1 = &((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              convertPathToDictionaryProtoCount;
    *piVar1 = *piVar1 + 1;
    TryConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
              (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),false);
    if ((DAT_015bf346 == '\x01') && ((instance->super_RecyclableObject).type.ptr == pTVar3)) {
      DynamicObject::ChangeType(instance);
    }
  }
LAB_00dc2f7c:
  newTypeHandler = (PathTypeHandlerBase *)DynamicTypeHandler::GetCurrentTypeHandler(instance);
  if (newTypeHandler != this) {
    (*(newTypeHandler->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x52])
              (newTypeHandler,instance);
    return;
  }
  DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
  TraceFixedFieldsAfterSetIsProto
            (instance,&this->super_DynamicTypeHandler,(DynamicTypeHandler *)newTypeHandler,oldType,
             (DynamicType *)(instance->super_RecyclableObject).type.ptr,oldSingletonInstanceBefore);
  return;
}

Assistant:

void PathTypeHandlerBase::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler is shared, this instance may not even be a prototype yet.
        // In this case we may need to convert to a non-shared type handler.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            SetFlags(IsPrototypeFlag);
            return;
        }

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldTypeDebug = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
#endif
#endif

        if ((GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            // The type coming in may not be shared or even locked (i.e. might have been created via DynamicObject::ChangeType()).
            // In that case the type handler change below won't change the type on the object, so we have to force it.

            DynamicType* oldType = instance->GetDynamicType();
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryProtoCount++;
#endif
            TryConvertToSimpleDictionaryType(instance, GetPathLength());

            if (ChangeTypeOnProto() && instance->GetDynamicType() == oldType)
            {
                instance->ChangeType();
            }
        }
        else
        {
#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsBeforeSetIsProto(instance, this, oldTypeDebug, oldSingletonInstance);
#endif
#endif

            if (ChangeTypeOnProto())
            {
                // If this handler is shared and we don't isolate prototypes, it's possible that the handler has
                // the prototype flag, but this instance may not yet be a prototype and may not have taken
                // the required type transition.  It would be nice to have a reliable flag on the object
                // indicating whether it's a prototype to avoid multiple type transitions if the same object
                // with shared type handler is used as prototype multiple times.
                if (((GetFlags() & IsPrototypeFlag) == 0) || (GetIsShared() && !IsolatePrototypes()))
                {
                    // We're about to split out the type.  If the original type was shared the handler better be shared as well.
                    // Otherwise, the handler would lose track of being shared between different types and instances.
                    Assert(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared());

                    instance->ChangeType();
                    Assert(!instance->HasLockedType() && !instance->HasSharedType());
                }
            }
        }

        DynamicTypeHandler* typeHandler = GetCurrentTypeHandler(instance);
        if (typeHandler != this)
        {
            typeHandler->SetIsPrototype(instance);
        }
        else
        {
            SetFlags(IsPrototypeFlag);

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterSetIsProto(instance, this, typeHandler, oldTypeDebug, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

        }
    }